

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_font_atlas_cleanup(nk_font_atlas *atlas)

{
  nk_font_config *local_20;
  nk_font_config *i;
  nk_font_config *iter;
  nk_font_atlas *atlas_local;
  
  if (atlas == (nk_font_atlas *)0x0) {
    __assert_fail("atlas",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                  ,0x35d7,"void nk_font_atlas_cleanup(struct nk_font_atlas *)");
  }
  if ((atlas->temporary).alloc == (nk_plugin_alloc)0x0) {
    __assert_fail("atlas->temporary.alloc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                  ,0x35d8,"void nk_font_atlas_cleanup(struct nk_font_atlas *)");
  }
  if ((atlas->temporary).free == (nk_plugin_free)0x0) {
    __assert_fail("atlas->temporary.free",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                  ,0x35d9,"void nk_font_atlas_cleanup(struct nk_font_atlas *)");
  }
  if ((atlas->permanent).alloc == (nk_plugin_alloc)0x0) {
    __assert_fail("atlas->permanent.alloc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                  ,0x35da,"void nk_font_atlas_cleanup(struct nk_font_atlas *)");
  }
  if ((atlas->permanent).free == (nk_plugin_free)0x0) {
    __assert_fail("atlas->permanent.free",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                  ,0x35db,"void nk_font_atlas_cleanup(struct nk_font_atlas *)");
  }
  if ((((atlas != (nk_font_atlas *)0x0) && ((atlas->permanent).alloc != (nk_plugin_alloc)0x0)) &&
      ((atlas->permanent).free != (nk_plugin_free)0x0)) && (atlas->config != (nk_font_config *)0x0))
  {
    for (i = atlas->config; i != (nk_font_config *)0x0; i = i->next) {
      for (local_20 = i->n; local_20 != i; local_20 = local_20->n) {
        (*(atlas->permanent).free)((atlas->permanent).userdata,local_20->ttf_blob);
        local_20->ttf_blob = (void *)0x0;
      }
      (*(atlas->permanent).free)((atlas->permanent).userdata,i->ttf_blob);
      i->ttf_blob = (void *)0x0;
    }
  }
  return;
}

Assistant:

NK_API void
nk_font_atlas_cleanup(struct nk_font_atlas *atlas)
{
    NK_ASSERT(atlas);
    NK_ASSERT(atlas->temporary.alloc);
    NK_ASSERT(atlas->temporary.free);
    NK_ASSERT(atlas->permanent.alloc);
    NK_ASSERT(atlas->permanent.free);
    if (!atlas || !atlas->permanent.alloc || !atlas->permanent.free) return;
    if (atlas->config) {
        struct nk_font_config *iter;
        for (iter = atlas->config; iter; iter = iter->next) {
            struct nk_font_config *i;
            for (i = iter->n; i != iter; i = i->n) {
                atlas->permanent.free(atlas->permanent.userdata, i->ttf_blob);
                i->ttf_blob = 0;
            }
            atlas->permanent.free(atlas->permanent.userdata, iter->ttf_blob);
            iter->ttf_blob = 0;
        }
    }
}